

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignData.cpp
# Opt level: O0

int adios2::core::engine::sqlcb_info(void *p,int argc,char **argv,char **azColName)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  string *in_RDI;
  char rest [32];
  CampaignData *cdp;
  char local_88 [63];
  allocator local_49;
  string local_48 [32];
  string *local_28;
  
  pcVar1 = (char *)*in_RDX;
  local_28 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  std::__cxx11::string::operator=(local_28,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar2 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar2,"%d.%d%s",local_28 + 0x20,local_28 + 0x24,local_88);
  if (local_88[0] != '\0') {
    __isoc99_sscanf(local_88,".%d%*s",local_28 + 0x28);
  }
  *(double *)(local_28 + 0x30) = (double)*(int *)(local_28 + 0x20);
  if (*(int *)(local_28 + 0x24) < 10) {
    *(double *)(local_28 + 0x30) =
         (double)*(int *)(local_28 + 0x24) / 10.0 + *(double *)(local_28 + 0x30);
  }
  else if (*(int *)(local_28 + 0x24) < 100) {
    *(double *)(local_28 + 0x30) =
         (double)*(int *)(local_28 + 0x24) / 100.0 + *(double *)(local_28 + 0x30);
  }
  return 0;
}

Assistant:

static int sqlcb_info(void *p, int argc, char **argv, char **azColName)
{
    CampaignData *cdp = reinterpret_cast<CampaignData *>(p);
    cdp->version.versionStr = std::string(argv[0]);

    char rest[32];
    std::sscanf(cdp->version.versionStr.c_str(), "%d.%d%s", &cdp->version.major,
                &cdp->version.minor, rest);
    if (rest[0])
    {
        sscanf(rest, ".%d%*s", &cdp->version.micro);
    }
    cdp->version.version = double(cdp->version.major);
    if (cdp->version.minor < 10)
        cdp->version.version += double(cdp->version.minor) / 10.0;
    else if (cdp->version.minor < 100)
        cdp->version.version += double(cdp->version.minor) / 100.0;

    return 0;
}